

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_split(NetOptimize *this)

{
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  pointer ppLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  long lVar6;
  Layer *pLVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  size_t j;
  ulong uVar11;
  uint uVar12;
  size_t k;
  long lVar13;
  ulong uVar14;
  
  pvVar2 = (this->super_ModelWriter).layers;
  ppLVar3 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppLVar4 = (pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar9 = 0;
  do {
    if (uVar9 == (long)ppLVar3 - (long)ppLVar4 >> 3) {
      return 0;
    }
    bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"Split");
    if (!bVar8) {
      pLVar5 = (((this->super_ModelWriter).layers)->
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      lVar6 = *(long *)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      uVar14 = 0xffffffffffffffff;
      uVar12 = 0;
      for (uVar11 = 0;
          (long)*(pointer *)
                 ((long)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
          lVar6 >> 2 != uVar11; uVar11 = uVar11 + 1) {
        bVar8 = (((this->super_ModelWriter).blobs)->
                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[*(int *)(lVar6 + uVar11 * 4)].consumer != -1;
        if (bVar8) {
          uVar14 = uVar11;
        }
        uVar14 = uVar14 & 0xffffffff;
        uVar12 = uVar12 + bVar8;
      }
      if (uVar12 < 2) {
        iVar1 = *(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = uVar9 & 0xffffffff;
LAB_0016808c:
        iVar10 = (int)uVar11;
        uVar12 = iVar10 - 1;
        uVar11 = (ulong)uVar12;
        if (-1 < (int)uVar12) break;
        lVar13 = -1;
LAB_001680f4:
        if (iVar10 != 0) {
          pLVar7 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar12];
          fprintf(_stderr,"eliminate_split %s %s\n",(pLVar7->name)._M_dataplus._M_p,
                  (pLVar5->name)._M_dataplus._M_p);
          iVar1 = *(int *)(*(long *)&(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data + (long)(int)uVar14 * 4);
          *(int *)(*(long *)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (long)(int)lVar13 * 4) = iVar1;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar1].producer = uVar12;
          std::__cxx11::string::assign((char *)&pLVar5->type);
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
  bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar12]->type,"ncnnfused");
  if (!bVar8) {
    pLVar7 = (((this->super_ModelWriter).layers)->
             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar12];
    lVar6 = *(long *)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar13 = 0;
        (long)*(pointer *)
               ((long)&(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
        lVar6 >> 2 != lVar13; lVar13 = lVar13 + 1) {
      if (*(int *)(lVar6 + lVar13 * 4) == iVar1) {
        if ((int)lVar13 != -1) goto LAB_001680f4;
        break;
      }
    }
  }
  goto LAB_0016808c;
}

Assistant:

int NetOptimize::eliminate_split()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Split")
            continue;

        ncnn::Layer* split = layers[i];

        int real_split_output_count = 0;
        int real_split_top_blob_index = -1;
        size_t top_blob_count = split->tops.size();
        for (size_t j = 0; j < top_blob_count; j++)
        {
            int top_blob_index_final = split->tops[j];
            if (blobs[top_blob_index_final].consumer != -1)
            {
                real_split_output_count += 1;
                real_split_top_blob_index = j;
            }
        }

        if (real_split_output_count > 1)
            continue;

        // Any - Pooling
        int bottom_blob_index = split->bottoms[0];

        int top_i = -1;
        int j = i - 1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            for (size_t k = 0; k < layers[j]->tops.size(); k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    top_i = k;
                    break;
                }
            }

            if (top_i != -1)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_split %s %s\n", any->name.c_str(), split->name.c_str());

        int top_blob_index_final = split->tops[real_split_top_blob_index];
        any->tops[top_i] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        split->type = "ncnnfused";
    }

    return 0;
}